

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::App::help(string *__return_storage_ptr__,App *this,string *prev,AppFormatMode mode)

{
  App *this_00;
  pointer pcVar1;
  element_type *peVar2;
  _Alloc_hider _Var3;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> selected_subcommands;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  if (prev->_M_string_length == 0) {
    ::std::__cxx11::string::_M_assign((string *)prev);
  }
  else {
    ::std::operator+(&local_90," ",&this->name_);
    ::std::__cxx11::string::_M_append((char *)prev,(ulong)local_90._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_90,&this->parsed_subcommands_
            );
  if (local_90._M_dataplus._M_p == (pointer)local_90._M_string_length) {
    peVar2 = (this->formatter_).super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pcVar1 = (prev->_M_dataplus)._M_p;
    local_70[0] = &local_60;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar1,pcVar1 + prev->_M_string_length);
    (*peVar2->_vptr_FormatterBase[2])(__return_storage_ptr__,peVar2,this,local_70,(ulong)mode);
    _Var3._M_p = (pointer)local_70[0];
    if (local_70[0] == &local_60) goto LAB_00126cf5;
  }
  else {
    this_00 = *(App **)local_90._M_dataplus._M_p;
    pcVar1 = (prev->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + prev->_M_string_length);
    help(__return_storage_ptr__,this_00,&local_50,mode);
    _Var3._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00126cf5;
  }
  operator_delete(_Var3._M_p);
LAB_00126cf5:
  if (local_90._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string help(std::string prev = "", AppFormatMode mode = AppFormatMode::Normal) const {
        if(prev.empty())
            prev = get_name();
        else
            prev += " " + get_name();

        // Delegate to subcommand if needed
        auto selected_subcommands = get_subcommands();
        if(!selected_subcommands.empty()) {
            return selected_subcommands.at(0)->help(prev, mode);
        }
        return formatter_->make_help(this, prev, mode);
    }